

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<unsigned_long> * __thiscall
google::protobuf::util::converter::DataPiece::GenericConvert<unsigned_long>
          (StatusOr<unsigned_long> *__return_storage_ptr__,DataPiece *this)

{
  float before;
  double before_00;
  StringPiece default_string;
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  unsigned_long in_RDX;
  unsigned_long *value;
  StringPiece value_str;
  StringPiece value_str_00;
  StringPiece value_str_01;
  StringPiece local_80;
  string local_70;
  undefined1 local_50 [40];
  unsigned_long local_28;
  
  switch(this->type_) {
  case TYPE_INT32:
    local_28 = (unsigned_long)(this->field_2).i32_;
    uVar1 = (ulong)(0 < (long)local_28) * 2 - 1;
    if (local_28 == 0) {
      uVar1 = 0;
    }
    if (uVar1 != (local_28 != 0)) {
      ValueAsString<int>(&local_70,(this->field_2).i32_);
      pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
      value_str.length_ = uVar1;
      value_str.ptr_ = pcVar2;
      anon_unknown_1::InvalidArgument
                ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str);
      StatusOr<unsigned_long>::StatusOr(__return_storage_ptr__,(Status *)local_50);
      goto LAB_003264f9;
    }
    break;
  case TYPE_INT64:
    local_28 = (this->field_2).i64_;
    uVar1 = (ulong)(0 < (long)local_28) * 2 - 1;
    if (local_28 == 0) {
      uVar1 = 0;
    }
    uVar3 = (ulong)(local_28 != 0);
    if (uVar1 != uVar3) {
      ValueAsString<long>(&local_70,local_28);
      pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
      value_str_01.length_ = uVar3;
      value_str_01.ptr_ = pcVar2;
      anon_unknown_1::InvalidArgument
                ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str_01);
      StatusOr<unsigned_long>::StatusOr(__return_storage_ptr__,(Status *)local_50);
      goto LAB_003264f9;
    }
    break;
  case TYPE_UINT32:
    local_50._0_8_ = ZEXT48((this->field_2).u32_);
    goto LAB_003263fe;
  case TYPE_UINT64:
    local_50._0_8_ = (this->field_2).i64_;
LAB_003263fe:
    value = (unsigned_long *)local_50;
    goto LAB_00326432;
  case TYPE_DOUBLE:
    before_00 = (this->field_2).double_;
    (anonymous_namespace)::ValidateNumberConversion<unsigned_long,double>
              (__return_storage_ptr__,
               (_anonymous_namespace_ *)
               ((long)(before_00 - 9.223372036854776e+18) & (long)before_00 >> 0x3f |
               (long)before_00),in_RDX,before_00);
    return __return_storage_ptr__;
  case TYPE_FLOAT:
    before = (this->field_2).float_;
    (anonymous_namespace)::ValidateNumberConversion<unsigned_long,float>
              (__return_storage_ptr__,
               (_anonymous_namespace_ *)
               ((long)(before - 9.223372e+18) & (long)before >> 0x3f | (long)before),in_RDX,before);
    return __return_storage_ptr__;
  default:
    StringPiece::StringPiece
              (&local_80,"Wrong type. Bool, Enum, String and Cord not supported in GenericConvert.")
    ;
    default_string.length_ = local_80.length_;
    default_string.ptr_ = local_80.ptr_;
    ValueAsStringOrDefault_abi_cxx11_(&local_70,this,default_string);
    pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
    value_str_00.length_ = local_80.length_;
    value_str_00.ptr_ = pcVar2;
    anon_unknown_1::InvalidArgument
              ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str_00);
    StatusOr<unsigned_long>::StatusOr(__return_storage_ptr__,(Status *)local_50);
LAB_003264f9:
    std::__cxx11::string::~string((string *)(local_50 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    return __return_storage_ptr__;
  }
  value = &local_28;
LAB_00326432:
  StatusOr<unsigned_long>::StatusOr(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> DataPiece::GenericConvert() const {
  switch (type_) {
    case TYPE_INT32:
      return NumberConvertAndCheck<To, int32>(i32_);
    case TYPE_INT64:
      return NumberConvertAndCheck<To, int64>(i64_);
    case TYPE_UINT32:
      return NumberConvertAndCheck<To, uint32>(u32_);
    case TYPE_UINT64:
      return NumberConvertAndCheck<To, uint64>(u64_);
    case TYPE_DOUBLE:
      return NumberConvertAndCheck<To, double>(double_);
    case TYPE_FLOAT:
      return NumberConvertAndCheck<To, float>(float_);
    default:  // TYPE_ENUM, TYPE_STRING, TYPE_CORD, TYPE_BOOL
      return InvalidArgument(ValueAsStringOrDefault(
          "Wrong type. Bool, Enum, String and Cord not supported in "
          "GenericConvert."));
  }
}